

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int uv__udp_disconnect(uv_udp_t *handle)

{
  int *piVar1;
  bool bVar2;
  undefined1 local_2c [8];
  sockaddr addr;
  int r;
  uv_udp_t *handle_local;
  
  unique0x100000c2 = handle;
  memset(local_2c,0,0x10);
  local_2c._0_2_ = 0;
  do {
    piVar1 = __errno_location();
    *piVar1 = 0;
    addr.sa_data._6_4_ = connect((stack0xffffffffffffffe8->io_watcher).fd,(sockaddr *)local_2c,0x10)
    ;
    bVar2 = false;
    if (addr.sa_data._6_4_ == -1) {
      piVar1 = __errno_location();
      bVar2 = *piVar1 == 4;
    }
  } while (bVar2);
  if (addr.sa_data._6_4_ == -1) {
    piVar1 = __errno_location();
    handle_local._4_4_ = -*piVar1;
  }
  else {
    stack0xffffffffffffffe8->flags = stack0xffffffffffffffe8->flags & 0xfdffffff;
    handle_local._4_4_ = 0;
  }
  return handle_local._4_4_;
}

Assistant:

int uv__udp_disconnect(uv_udp_t* handle) {
    int r;
#if defined(__MVS__)
    struct sockaddr_storage addr;
#else
    struct sockaddr addr;
#endif

    memset(&addr, 0, sizeof(addr));

#if defined(__MVS__)
    addr.ss_family = AF_UNSPEC;
#else
    addr.sa_family = AF_UNSPEC;
#endif

    do {
      errno = 0;
#ifdef __PASE__
      /* On IBMi a connectionless transport socket can be disconnected by
       * either setting the addr parameter to NULL or setting the
       * addr_length parameter to zero, and issuing another connect().
       * https://www.ibm.com/docs/en/i/7.4?topic=ssw_ibm_i_74/apis/connec.htm
       */
      r = connect(handle->io_watcher.fd, (struct sockaddr*) NULL, 0);
#else
      r = connect(handle->io_watcher.fd, (struct sockaddr*) &addr, sizeof(addr));
#endif
    } while (r == -1 && errno == EINTR);

    if (r == -1) {
#if defined(BSD)  /* The macro BSD is from sys/param.h */
      if (errno != EAFNOSUPPORT && errno != EINVAL)
        return UV__ERR(errno);
#else
      return UV__ERR(errno);
#endif
    }

    handle->flags &= ~UV_HANDLE_UDP_CONNECTED;
    return 0;
}